

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

VkSwapchainCreateInfoKHR *
vkt::wsi::anon_unknown_0::createSwapchainConfig
          (VkSwapchainCreateInfoKHR *__return_storage_ptr__,VkSurfaceKHR surface,
          deUint32 queueFamilyIndex,VkSurfaceCapabilitiesKHR *properties,
          vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *formats,
          vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *presentModes,
          VkPresentModeKHR presentMode)

{
  VkImageUsageFlags VVar1;
  VkFormat VVar2;
  VkColorSpaceKHR VVar3;
  VkExtent2D VVar4;
  size_type sVar5;
  const_reference pvVar6;
  NotSupportedError *this;
  const_reference pvVar7;
  uint local_98;
  uint local_94;
  VkColorSpaceKHR imageColorSpace;
  VkFormat imageFormat;
  VkCompositeAlphaFlagBitsKHR compositeAlpha;
  VkSurfaceTransformFlagBitsKHR preTransform;
  VkCompositeAlphaFlagsKHR alpha;
  VkSurfaceTransformFlagsKHR transform;
  ulong local_58;
  size_t presentModeNdx;
  VkExtent2D imageSize;
  deUint32 imageHeight;
  deUint32 imageWidth;
  VkBool32 clipped;
  VkImageUsageFlags imageUsage;
  deUint32 imageLayers;
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *presentModes_local;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *formats_local;
  VkSurfaceCapabilitiesKHR *properties_local;
  VkSurfaceKHR VStack_10;
  deUint32 queueFamilyIndex_local;
  VkSurfaceKHR surface_local;
  
  VVar1 = properties->supportedUsageFlags;
  properties_local._4_4_ = queueFamilyIndex;
  VStack_10.m_internal = surface.m_internal;
  if ((properties->currentExtent).width == 0xffffffff) {
    local_94 = de::min<unsigned_int>
                         (0x400,(properties->minImageExtent).width +
                                ((properties->maxImageExtent).width -
                                 (properties->minImageExtent).width >> 1));
  }
  else {
    local_94 = (properties->currentExtent).width;
  }
  if ((properties->currentExtent).height == 0xffffffff) {
    local_98 = de::min<unsigned_int>
                         (0x400,(properties->minImageExtent).height +
                                ((properties->maxImageExtent).height -
                                 (properties->minImageExtent).height >> 1));
  }
  else {
    local_98 = (properties->currentExtent).height;
  }
  local_58 = 0;
  while ((sVar5 = std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::size
                            (presentModes), local_58 < sVar5 &&
         (pvVar6 = std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::
                   operator[](presentModes,local_58), *pvVar6 != presentMode))) {
    local_58 = local_58 + 1;
  }
  sVar5 = std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::size
                    (presentModes);
  if (local_58 != sVar5) {
    for (preTransform = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
        (preTransform <= properties->supportedTransforms &&
        ((properties->supportedTransforms & preTransform) == 0)); preTransform = preTransform << 1)
    {
    }
    for (compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
        (compositeAlpha <= properties->supportedCompositeAlpha &&
        ((compositeAlpha & properties->supportedCompositeAlpha) == 0));
        compositeAlpha = compositeAlpha << 1) {
    }
    pvVar7 = std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::
             operator[](formats,0);
    VVar2 = pvVar7->format;
    pvVar7 = std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::
             operator[](formats,0);
    VVar3 = pvVar7->colorSpace;
    __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    __return_storage_ptr__->pNext = (void *)0x0;
    __return_storage_ptr__->flags = 0;
    (__return_storage_ptr__->surface).m_internal = VStack_10.m_internal;
    __return_storage_ptr__->minImageCount = properties->minImageCount;
    __return_storage_ptr__->imageFormat = VVar2;
    __return_storage_ptr__->imageColorSpace = VVar3;
    VVar4.height = local_98;
    VVar4.width = local_94;
    __return_storage_ptr__->imageExtent = VVar4;
    __return_storage_ptr__->imageArrayLayers = 1;
    __return_storage_ptr__->imageUsage = VVar1;
    __return_storage_ptr__->imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    __return_storage_ptr__->queueFamilyIndexCount = 1;
    __return_storage_ptr__->pQueueFamilyIndices = (deUint32 *)((long)&properties_local + 4);
    __return_storage_ptr__->preTransform = preTransform;
    __return_storage_ptr__->compositeAlpha = compositeAlpha;
    __return_storage_ptr__->presentMode = presentMode;
    __return_storage_ptr__->clipped = 0;
    ::vk::Handle<(vk::HandleType)26>::Handle(&__return_storage_ptr__->oldSwapchain,0);
    return __return_storage_ptr__;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"Present mode not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
             ,0x36d);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

vk::VkSwapchainCreateInfoKHR createSwapchainConfig (vk::VkSurfaceKHR						surface,
													deUint32								queueFamilyIndex,
													const vk::VkSurfaceCapabilitiesKHR&		properties,
													const vector<vk::VkSurfaceFormatKHR>&	formats,
													const vector<vk::VkPresentModeKHR>&		presentModes,
													vk::VkPresentModeKHR					presentMode)
{
	const deUint32				imageLayers		= 1u;
	const vk::VkImageUsageFlags	imageUsage		= properties.supportedUsageFlags;
	const vk::VkBool32			clipped			= VK_FALSE;

	const deUint32				imageWidth		= (properties.currentExtent.width != 0xFFFFFFFFu)
													? properties.currentExtent.width
													: de::min(1024u, properties.minImageExtent.width + ((properties.maxImageExtent.width - properties.minImageExtent.width) / 2));
	const deUint32				imageHeight		= (properties.currentExtent.height != 0xFFFFFFFFu)
													? properties.currentExtent.height
													: de::min(1024u, properties.minImageExtent.height + ((properties.maxImageExtent.height - properties.minImageExtent.height) / 2));
	const vk::VkExtent2D		imageSize		= { imageWidth, imageHeight };

	{
		size_t presentModeNdx;

		for (presentModeNdx = 0; presentModeNdx < presentModes.size(); presentModeNdx++)
		{
			if (presentModes[presentModeNdx] == presentMode)
				break;
		}

		if (presentModeNdx == presentModes.size())
			TCU_THROW(NotSupportedError, "Present mode not supported");
	}

	// Pick the first supported transform, alpha, and format:
	vk::VkSurfaceTransformFlagsKHR transform;
	for (transform = 1u; transform <= properties.supportedTransforms; transform = transform << 1u)
	{
		if ((properties.supportedTransforms & transform) != 0)
			break;
    }

	vk::VkCompositeAlphaFlagsKHR alpha;
	for (alpha = 1u; alpha <= properties.supportedCompositeAlpha; alpha = alpha << 1u)
	{
		if ((alpha & properties.supportedCompositeAlpha) != 0)
			break;
	}

	{
		const vk::VkSurfaceTransformFlagBitsKHR	preTransform	= (vk::VkSurfaceTransformFlagBitsKHR)transform;
		const vk::VkCompositeAlphaFlagBitsKHR	compositeAlpha	= (vk::VkCompositeAlphaFlagBitsKHR)alpha;
		const vk::VkFormat						imageFormat		= formats[0].format;
		const vk::VkColorSpaceKHR				imageColorSpace	= formats[0].colorSpace;
		const vk::VkSwapchainCreateInfoKHR		createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR,
			DE_NULL,
			0u,
			surface,
			properties.minImageCount,
			imageFormat,
			imageColorSpace,
			imageSize,
			imageLayers,
			imageUsage,
			vk::VK_SHARING_MODE_EXCLUSIVE,
			1u,
			&queueFamilyIndex,
			preTransform,
			compositeAlpha,
			presentMode,
			clipped,
			(vk::VkSwapchainKHR)0
		};

		return createInfo;
	}
}